

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParameterizedTestSuiteInfo<AV1Kmeans::AV1KmeansTest1> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<AV1Kmeans::AV1KmeansTest1>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  pointer ppPVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestSuiteInfo<AV1Kmeans::AV1KmeansTest1> *pPVar4;
  pointer ppPVar5;
  ParameterizedTestSuiteInfo<AV1Kmeans::AV1KmeansTest1> *local_80;
  CodeLocation local_78;
  CodeLocation local_50;
  
  ppPVar5 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar1 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppPVar5 == ppPVar1) {
LAB_006398b7:
      pPVar4 = (ParameterizedTestSuiteInfo<AV1Kmeans::AV1KmeansTest1> *)operator_new(0x80);
      CodeLocation::CodeLocation(&local_78,code_location);
      ParameterizedTestSuiteInfo<AV1Kmeans::AV1KmeansTest1>::ParameterizedTestSuiteInfo
                (pPVar4,test_suite_name,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      local_80 = pPVar4;
      std::
      vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
      ::emplace_back<testing::internal::ParameterizedTestSuiteInfoBase*>
                ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
                  *)this,(ParameterizedTestSuiteInfoBase **)&local_80);
      return pPVar4;
    }
    iVar3 = (*(*ppPVar5)->_vptr_ParameterizedTestSuiteInfoBase[2])();
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var,iVar3),test_suite_name);
    if (bVar2) {
      iVar3 = (*(*ppPVar5)->_vptr_ParameterizedTestSuiteInfoBase[3])();
      if ((undefined1 *)CONCAT44(extraout_var_00,iVar3) !=
          &TypeIdHelper<AV1Kmeans::AV1KmeansTest1>::dummy_) {
        CodeLocation::CodeLocation(&local_50,code_location);
        ReportInvalidTestSuiteType(test_suite_name,&local_50);
        CodeLocation::~CodeLocation(&local_50);
        posix::Abort();
      }
      pPVar4 = CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<AV1Kmeans::AV1KmeansTest1>,testing::internal::ParameterizedTestSuiteInfoBase>
                         (*ppPVar5);
      if (pPVar4 != (ParameterizedTestSuiteInfo<AV1Kmeans::AV1KmeansTest1> *)0x0) {
        return pPVar4;
      }
      goto LAB_006398b7;
    }
    ppPVar5 = ppPVar5 + 1;
  } while( true );
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite>>(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }